

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

BrotliDecoderResult SaveErrorCode(BrotliDecoderStateInternal *s,BrotliDecoderErrorCode e)

{
  BrotliDecoderErrorCode e_local;
  BrotliDecoderStateInternal *s_local;
  
  s->error_code = e;
  if (e == BROTLI_DECODER_SUCCESS) {
    s_local._4_4_ = BROTLI_DECODER_RESULT_SUCCESS;
  }
  else if (e == BROTLI_DECODER_NEEDS_MORE_INPUT) {
    s_local._4_4_ = BROTLI_DECODER_RESULT_NEEDS_MORE_INPUT;
  }
  else if (e == BROTLI_DECODER_NEEDS_MORE_OUTPUT) {
    s_local._4_4_ = BROTLI_DECODER_RESULT_NEEDS_MORE_OUTPUT;
  }
  else {
    s_local._4_4_ = BROTLI_DECODER_RESULT_ERROR;
  }
  return s_local._4_4_;
}

Assistant:

static BROTLI_NOINLINE BrotliDecoderResult SaveErrorCode(
    BrotliDecoderState* s, BrotliDecoderErrorCode e) {
  s->error_code = (int)e;
  switch (e) {
    case BROTLI_DECODER_SUCCESS:
      return BROTLI_DECODER_RESULT_SUCCESS;
    case BROTLI_DECODER_NEEDS_MORE_INPUT:
      return BROTLI_DECODER_RESULT_NEEDS_MORE_INPUT;
    case BROTLI_DECODER_NEEDS_MORE_OUTPUT:
      return BROTLI_DECODER_RESULT_NEEDS_MORE_OUTPUT;
    default:
      return BROTLI_DECODER_RESULT_ERROR;
  }
}